

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

Fl_Type * Fl_Type_make(char *tn)

{
  int iVar1;
  void *pvVar2;
  long *plVar3;
  char *pcVar4;
  Fl_Type *pFVar5;
  Fl_Type *t;
  Fl_Menu_Item *m;
  uint i;
  Fl_Type *r;
  char *tn_local;
  
  reading_file = 1;
  m._4_4_ = 0;
  do {
    if (0x44 < m._4_4_) {
      reading_file = 0;
      return (Fl_Type *)0x0;
    }
    pvVar2 = Fl_Menu_Item::user_data(New_Menu + m._4_4_);
    if (pvVar2 != (void *)0x0) {
      plVar3 = (long *)Fl_Menu_Item::user_data(New_Menu + m._4_4_);
      pcVar4 = (char *)(**(code **)(*plVar3 + 0x28))();
      iVar1 = fl_ascii_strcasecmp(tn,pcVar4);
      if (iVar1 == 0) {
        pFVar5 = (Fl_Type *)(**(code **)(*plVar3 + 0x18))();
        reading_file = 0;
        return pFVar5;
      }
      pcVar4 = (char *)(**(code **)(*plVar3 + 0x30))();
      iVar1 = fl_ascii_strcasecmp(tn,pcVar4);
      if (iVar1 == 0) {
        pFVar5 = (Fl_Type *)(**(code **)(*plVar3 + 0x18))();
        reading_file = 0;
        return pFVar5;
      }
    }
    m._4_4_ = m._4_4_ + 1;
  } while( true );
}

Assistant:

Fl_Type *Fl_Type_make(const char *tn) {
  reading_file = 1; // makes labels be null
  Fl_Type *r = 0;
  for (unsigned i = 0; i < sizeof(New_Menu)/sizeof(*New_Menu); i++) {
    Fl_Menu_Item *m = New_Menu+i;
    if (!m->user_data()) continue;
    Fl_Type *t = (Fl_Type*)(m->user_data());
    if (!fl_ascii_strcasecmp(tn,t->type_name())) {r = t->make(); break;}
    if (!fl_ascii_strcasecmp(tn,t->alt_type_name())) {r = t->make(); break;}
  }
  reading_file = 0;
  return r;
}